

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputInput(Node *this,ostream *os,int InputFlag)

{
  ostream *poVar1;
  int iVar2;
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  IOChPrinted = '\0';
  IOChannel = (Node *)0x0;
  IOUsing = (Node *)0x0;
  if (this->Tree[0] != (Node *)0x0) {
    OutputInputData(this->Tree[0],os,InputFlag);
    if (IOChPrinted == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
    }
  }
  if ((InputFlag & 1U) != 0) {
    iVar2 = 0;
    if (0 < Level) {
      iVar2 = Level;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"if (",4);
    GetIPChannel_abi_cxx11_(&local_90,IOChannel,InputFlag);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".fail()) { ",0xb);
    GetIPChannel_abi_cxx11_(&local_50,IOChannel,InputFlag);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".clear();",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    iVar2 = 0;
    if (0 < Level) {
      iVar2 = Level;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
    GetIPChannel_abi_cxx11_(&local_90,IOChannel,InputFlag);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,".ignore(std::numeric_limits<std::streamsize>::max(), \'\\n\'); }",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void Node::OutputInput(
	std::ostream& os,	/**< iostream to write C++ code to */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Initialize flags
	//
	IOChPrinted = 0;		// Channel not yet printed
	IOChannel = 0;		// No channel specified
	IOUsing = 0;			// No print using specified

	//
	// Write out input statements
	//
	if (Tree[0] != 0)
	{
		Tree[0]->OutputInputData(os, InputFlag);
	}

	//
	// Finish off input statement
	//
	if (IOChPrinted != 0)
	{
		os << ";" << std::endl;
	}
	
	//
	// Try to handle bad entries with more grace.
	// Eat the bad entry instead of letting it block the next input.
	//
	if (InputFlag & 1)
	{
		os << Indent() <<
			"if (" << GetIPChannel(IOChannel, InputFlag) <<
			".fail()) { " << 
			GetIPChannel(IOChannel, InputFlag) << ".clear();" <<
			std::endl;
		os << Indent() <<
			GetIPChannel(IOChannel, InputFlag) << 
			".ignore(std::numeric_limits<std::streamsize>::max(), '\\n'); }" <<
			std::endl;
	}
}